

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

void __thiscall QIconLoader::ensureInitialized(QIconLoader *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  int local_34;
  QMultiMap<int,_QString> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_initialized == false) &&
     (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0)) {
    this->m_initialized = true;
    systemThemeName();
    pDVar2 = (this->m_systemTheme).d.d;
    pcVar3 = (this->m_systemTheme).d.ptr;
    (this->m_systemTheme).d.d = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    (this->m_systemTheme).d.ptr = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(pDVar2,0);
    local_58.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    local_58.ptr._0_4_ = SUB84(pcVar3,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
    qVar1 = (this->m_systemTheme).d.size;
    (this->m_systemTheme).d.size = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = (undefined4)qVar1;
    local_58.size._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if ((this->m_systemTheme).d.size == 0) {
      systemFallbackThemeName();
      pDVar2 = (this->m_systemTheme).d.d;
      pcVar3 = (this->m_systemTheme).d.ptr;
      (this->m_systemTheme).d.d = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
      (this->m_systemTheme).d.ptr = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      local_58.d._0_4_ = SUB84(pDVar2,0);
      local_58.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      local_58.ptr._0_4_ = SUB84(pcVar3,0);
      local_58.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      qVar1 = (this->m_systemTheme).d.size;
      (this->m_systemTheme).d.size = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
      local_58.size._0_4_ = (undefined4)qVar1;
      local_58.size._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    qt_iconEngineFactoryLoader();
    QFactoryLoader::keyMap();
    latin1.m_data = "svg";
    latin1.m_size = 3;
    QString::QString((QString *)&local_58,latin1);
    local_34 = -1;
    iVar4 = QMultiMap<int,_QString>::key(&local_30,(QString *)&local_58,&local_34);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_30.d);
    if (iVar4 != -1) {
      this->m_supportsSvg = true;
    }
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_58.d._0_4_ = 2;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_58.size._4_4_ = 0;
      local_40 = lcIconLoader::category.name;
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<((QDebug *)&local_30,"Initialized icon loader with system theme");
      pQVar5 = QDebug::operator<<(pQVar5,&this->m_systemTheme);
      pQVar5 = QDebug::operator<<(pQVar5,"and SVG support");
      QDebug::operator<<(pQVar5,this->m_supportsSvg);
      QDebug::~QDebug((QDebug *)&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconLoader::ensureInitialized()
{
    if (!m_initialized) {
        if (!QGuiApplicationPrivate::platformTheme())
            return; // it's too early: try again later (QTBUG-74252)
        m_initialized = true;
        m_systemTheme = systemThemeName();

        if (m_systemTheme.isEmpty())
            m_systemTheme = systemFallbackThemeName();
        if (qt_iconEngineFactoryLoader()->keyMap().key("svg"_L1, -1) != -1)
            m_supportsSvg = true;

        qCDebug(lcIconLoader) << "Initialized icon loader with system theme"
            << m_systemTheme << "and SVG support" << m_supportsSvg;
    }
}